

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cast.hpp
# Opt level: O2

uchar Diligent::StaticCast<unsigned_char,unsigned_long>(unsigned_long *Src)

{
  ulong uVar1;
  string msg;
  
  uVar1 = *Src;
  if (0xff < uVar1) {
    FormatString<char[20]>(&msg,(char (*) [20])"Cast will lose data");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"StaticCast",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Cast.hpp"
               ,0x40);
    std::__cxx11::string::~string((string *)&msg);
    uVar1 = *Src;
  }
  return (uchar)uVar1;
}

Assistant:

NODISCARD DstType StaticCast(const SrcType& Src)
{
#ifdef DILIGENT_DEBUG
    using MaxType = decltype(DstType{1} + SrcType{1});
    VERIFY(static_cast<MaxType>(Src) == static_cast<MaxType>(static_cast<DstType>(Src)), "Cast will lose data");
#endif
    return static_cast<DstType>(Src);
}